

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict
sexp_bit_ior(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  sexp_uint_t *psVar1;
  ulong *puVar2;
  long lVar3;
  sexp_conflict psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  sexp_conflict res;
  sexp_conflict local_50;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  res = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  local_50 = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  if (((ulong)x & 1) == 0) {
    psVar4 = x;
    if ((((ulong)x & 2) == 0) && (x->tag == 0xc)) {
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      __sexp_gc_preserver2.var = &local_50;
      (ctx->value).context.saves = &__sexp_gc_preserver2;
      if (((ulong)y & 1) == 0) {
        if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
          if ((y->value).type.cpl <= (x->value).type.cpl) goto LAB_0010172e;
          __sexp_gc_preserver1.var = &res;
          res = (sexp_conflict)sexp_copy_bignum(ctx,0,y,0);
          lVar8 = (res->value).fileno.fd;
LAB_00101751:
          local_50 = sexp_twos_complement(ctx,x);
LAB_00101760:
          if ((res->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(res);
          }
          lVar3 = (local_50->value).fileno.fd;
          lVar5 = 0;
          lVar6 = 0;
          if (0 < lVar8) {
            lVar6 = lVar8;
          }
          for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
            if (lVar5 < lVar3) {
              uVar7 = *(ulong *)((long)&local_50->value + lVar5 * 8 + 0x10);
            }
            else {
              uVar7 = (ulong)((local_50->value).flonum_bits[0] >> 7);
            }
            puVar2 = (ulong *)((long)&res->value + lVar5 * 8 + 0x10);
            *puVar2 = *puVar2 | uVar7;
          }
          if ((((res->value).flonum_bits[0] < '\0') || ((local_50->value).flonum_bits[0] < '\0')) &&
             (*(long *)((long)&res->value + lVar8 * 8 + 8) < 0)) {
            sexp_set_twos_complement(res);
            if ('\0' < (res->value).flonum_bits[0]) {
              if ((((ulong)res & 3) == 0) && (res->tag == 0xc)) {
                (res->value).flonum_bits[0] = -(res->value).flonum_bits[0];
              }
              else if (((ulong)res & 1) != 0) {
                res = (sexp_conflict)(1 - ((ulong)res & 0xfffffffffffffffe));
              }
            }
          }
        }
        else {
          __sexp_gc_preserver1.var = &res;
          res = (sexp_conflict)sexp_type_exception(ctx,self,2,y);
        }
      }
      else {
        uVar7 = (long)y >> 1;
        if ((long)uVar7 < 0) {
LAB_0010172e:
          __sexp_gc_preserver1.var = &res;
          res = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
          lVar8 = (res->value).fileno.fd;
          x = y;
          if (((ulong)y & 1) == 0) goto LAB_00101751;
          local_50 = sexp_fixnum_to_twos_complement(ctx,y,(int)lVar8);
          goto LAB_00101760;
        }
        __sexp_gc_preserver1.var = &res;
        res = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
        if ((res->value).flonum_bits[0] < '\0') {
          sexp_set_twos_complement(res);
          psVar1 = &(res->value).string.length;
          *psVar1 = *psVar1 | uVar7;
          if ((res->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(res);
          }
        }
        else {
          psVar1 = &(res->value).string.length;
          *psVar1 = *psVar1 | uVar7;
        }
      }
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      goto LAB_001016cf;
    }
  }
  else {
    if (((ulong)y & 1) != 0) {
      res = (sexp_conflict)((ulong)y | (ulong)x);
      goto LAB_001016cf;
    }
    psVar4 = y;
    if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
      res = sexp_bit_ior(ctx,self,n,y,x);
      goto LAB_001016cf;
    }
  }
  res = (sexp_conflict)sexp_type_exception(ctx,self,2,psVar4);
LAB_001016cf:
  psVar4 = (sexp_conflict)sexp_bignum_normalize(res);
  return psVar4;
}

Assistant:

sexp sexp_bit_ior (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, tmplen, i;
#endif
  sexp_gc_var2(res, tmp);
  if (sexp_fixnump(x)) {
    if (sexp_fixnump(y))
      res = (sexp) ((sexp_uint_t)x | (sexp_uint_t)y);
#if SEXP_USE_BIGNUMS
    else if (sexp_bignump(y))
      res = sexp_bit_ior(ctx, self, n, y, x);
#endif
    else
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve2(ctx, res, tmp);
    if (sexp_fixnump(y) && sexp_unbox_fixnum(y) >= 0) {
      res = sexp_copy_bignum(ctx, NULL, x, 0);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      sexp_bignum_data(res)[0] |= (sexp_uint_t)sexp_unbox_fixnum(y);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
    } else if (sexp_bignump(y) || sexp_fixnump(y)) {
      if (sexp_fixnump(y) || sexp_bignum_length(x) >= sexp_bignum_length(y)) {
        res = sexp_copy_bignum(ctx, NULL, x, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_fixnump(y) ? sexp_fixnum_to_twos_complement(ctx, y, len) : sexp_twos_complement(ctx, y);
      } else {
        res = sexp_copy_bignum(ctx, NULL, y, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_twos_complement(ctx, x);
      }
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      tmplen = sexp_bignum_length(tmp);
      for (i=0; i<len; i++)
        sexp_bignum_data(res)[i] |= (i<tmplen ? sexp_bignum_data(tmp)[i] : sexp_bignum_sign(tmp) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(res) < 0 || sexp_bignum_sign(tmp) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
    }
    sexp_gc_release2(ctx);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return sexp_bignum_normalize(res);
}